

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglprogrambinarycache.cpp
# Opt level: O3

void __thiscall
QOpenGLProgramBinarySupportCheck::QOpenGLProgramBinarySupportCheck
          (QOpenGLProgramBinarySupportCheck *this,QOpenGLContext *context)

{
  QOpenGLContext *this_00;
  int *piVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  QOpenGLContextGroup *group;
  QOpenGLContext *this_01;
  QOpenGLFunctions *pQVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  GLint fmtCount;
  undefined1 local_58 [8];
  QByteArray local_50;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  group = QOpenGLContext::shareGroup(context);
  QOpenGLSharedResource::QOpenGLSharedResource(&this->super_QOpenGLSharedResource,group);
  (this->super_QOpenGLSharedResource)._vptr_QOpenGLSharedResource =
       (_func_int **)&PTR__QOpenGLSharedResourceGuard_007de760;
  this->m_supported = false;
  cVar2 = QCoreApplication::testAttribute(AA_DisableShaderDiskCache);
  if (cVar2 == '\0') {
    iVar4 = qEnvironmentVariableIntValue("QT_DISABLE_SHADER_DISK_CACHE",(bool *)0x0);
    if (iVar4 == 0) {
      this_01 = QOpenGLContext::currentContext();
      if (this_01 != (QOpenGLContext *)0x0) {
        bVar3 = QOpenGLContext::isOpenGLES(this_01);
        if (bVar3) {
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) != 0) {
            local_50.d.d._0_4_ = 2;
            local_50.d.d._4_4_ = 0;
            local_50.d.ptr._0_4_ = 0;
            local_50.d._12_8_ = 0;
            local_50.d.size._4_4_ = 0;
            local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
            QOpenGLContext::format((QOpenGLContext *)local_58);
            uVar5 = QSurfaceFormat::majorVersion((QSurfaceFormat *)local_58);
            QMessageLogger::debug(local_58 + 8,"OpenGL ES v%d context",(ulong)uVar5);
            QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)local_58);
          }
          this_00 = (QOpenGLContext *)(local_58 + 8);
          QOpenGLContext::format(this_00);
          iVar4 = QSurfaceFormat::majorVersion((QSurfaceFormat *)this_00);
          QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)this_00);
          if (iVar4 < 3) {
            QByteArray::QByteArray((QByteArray *)(local_58 + 8),"GL_OES_get_program_binary",-1);
            bVar3 = QOpenGLContext::hasExtension(this_01,(QByteArray *)(local_58 + 8));
            piVar1 = (int *)CONCAT44(local_50.d.d._4_4_,local_50.d.d._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                QArrayData::deallocate
                          ((QArrayData *)CONCAT44(local_50.d.d._4_4_,local_50.d.d._0_4_),1,0x10);
              }
            }
            QtPrivateLogging::lcOpenGLProgramDiskCache();
            if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.
                       enabledDebug._q_value._M_base._M_i & 1) != 0) {
              pcVar7 = "GL_OES_get_program_binary support = %d";
              goto LAB_00560146;
            }
            goto LAB_0056014d;
          }
LAB_00560152:
          this->m_supported = true;
        }
        else {
          QByteArray::QByteArray((QByteArray *)(local_58 + 8),"GL_ARB_get_program_binary",-1);
          bVar3 = QOpenGLContext::hasExtension(this_01,(QByteArray *)(local_58 + 8));
          piVar1 = (int *)CONCAT44(local_50.d.d._4_4_,local_50.d.d._0_4_);
          if (piVar1 != (int *)0x0) {
            LOCK();
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (*piVar1 == 0) {
              QArrayData::deallocate
                        ((QArrayData *)CONCAT44(local_50.d.d._4_4_,local_50.d.d._0_4_),1,0x10);
            }
          }
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) != 0) {
            pcVar7 = "GL_ARB_get_program_binary support = %d";
LAB_00560146:
            local_50.d.size._4_4_ = 0;
            local_50.d._12_8_ = 0;
            local_50.d.ptr._0_4_ = 0;
            local_50.d.d._4_4_ = 0;
            local_50.d.d._0_4_ = 2;
            local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
            QMessageLogger::debug(local_58 + 8,pcVar7,(ulong)bVar3);
          }
LAB_0056014d:
          if (bVar3 != false) goto LAB_00560152;
        }
        if (this->m_supported == true) {
          local_58._0_4_ = 0;
          pQVar6 = QOpenGLContext::functions(this_01);
          (*(pQVar6->d_ptr->field_0).functions[0x19])(0x87fe,local_58);
          QtPrivateLogging::lcOpenGLProgramDiskCache();
          if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug
                     ._q_value._M_base._M_i & 1) != 0) {
            local_50.d.d._0_4_ = 2;
            local_50.d.d._4_4_ = 0;
            local_50.d.ptr._0_4_ = 0;
            local_50.d._12_8_ = 0;
            local_50.d.size._4_4_ = 0;
            local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
            QMessageLogger::debug
                      (local_58 + 8,"Supported binary format count = %d",(ulong)(uint)local_58._0_4_
                      );
          }
          this->m_supported = 0 < (int)local_58._0_4_;
        }
      }
      QtPrivateLogging::lcOpenGLProgramDiskCache();
      if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
                 _q_value._M_base._M_i & 1) != 0) {
        local_50.d.d._0_4_ = 2;
        local_50.d.d._4_4_ = 0;
        local_50.d.ptr._0_4_ = 0;
        local_50.d._12_8_ = 0;
        local_50.d.size._4_4_ = 0;
        local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
        QMessageLogger::debug(local_58 + 8,"Shader cache supported = %d",(ulong)this->m_supported);
      }
      goto LAB_0055ff5b;
    }
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
               _q_value._M_base._M_i & 1) == 0) goto LAB_0055ff5b;
    pcVar7 = "Shader cache disabled via env var";
  }
  else {
    QtPrivateLogging::lcOpenGLProgramDiskCache();
    if (((byte)QtPrivateLogging::lcOpenGLProgramDiskCache::category.field_2.bools.enabledDebug.
               _q_value._M_base._M_i & 1) == 0) goto LAB_0055ff5b;
    pcVar7 = "Shader cache disabled via app attribute";
  }
  local_50.d.size._4_4_ = 0;
  local_50.d._12_8_ = 0;
  local_50.d.ptr._0_4_ = 0;
  local_50.d.d._4_4_ = 0;
  local_50.d.d._0_4_ = 2;
  local_38 = QtPrivateLogging::lcOpenGLProgramDiskCache::category.name;
  QMessageLogger::debug(local_58 + 8,pcVar7);
LAB_0055ff5b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QOpenGLProgramBinarySupportCheck::QOpenGLProgramBinarySupportCheck(QOpenGLContext *context)
    : QOpenGLSharedResource(context->shareGroup()),
      m_supported(false)
{
    if (QCoreApplication::testAttribute(Qt::AA_DisableShaderDiskCache)) {
        qCDebug(lcOpenGLProgramDiskCache, "Shader cache disabled via app attribute");
        return;
    }
    if (qEnvironmentVariableIntValue("QT_DISABLE_SHADER_DISK_CACHE")) {
        qCDebug(lcOpenGLProgramDiskCache, "Shader cache disabled via env var");
        return;
    }

    QOpenGLContext *ctx = QOpenGLContext::currentContext();
    if (ctx) {
        if (ctx->isOpenGLES()) {
            qCDebug(lcOpenGLProgramDiskCache, "OpenGL ES v%d context", ctx->format().majorVersion());
            if (ctx->format().majorVersion() >= 3) {
                m_supported = true;
            } else {
                const bool hasExt = ctx->hasExtension("GL_OES_get_program_binary");
                qCDebug(lcOpenGLProgramDiskCache, "GL_OES_get_program_binary support = %d", hasExt);
                if (hasExt)
                    m_supported = true;
            }
        } else {
            const bool hasExt = ctx->hasExtension("GL_ARB_get_program_binary");
            qCDebug(lcOpenGLProgramDiskCache, "GL_ARB_get_program_binary support = %d", hasExt);
            if (hasExt)
                m_supported = true;
        }
        if (m_supported) {
            GLint fmtCount = 0;
            ctx->functions()->glGetIntegerv(GL_NUM_PROGRAM_BINARY_FORMATS, &fmtCount);
            qCDebug(lcOpenGLProgramDiskCache, "Supported binary format count = %d", fmtCount);
            m_supported = fmtCount > 0;
        }
    }
    qCDebug(lcOpenGLProgramDiskCache, "Shader cache supported = %d", m_supported);
}